

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

bool __thiscall ArgsManager::ParseParameters(ArgsManager *this,int argc,char **argv,string *error)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  string key_00;
  bool bVar1;
  int iVar2;
  void *pvVar3;
  optional<unsigned_int> oVar4;
  mapped_type *pmVar5;
  SettingsValue *pSVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined8 uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  int iVar10;
  string *psVar11;
  char **ppcVar12;
  long lVar13;
  long in_FS_OFFSET;
  char cVar14;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  optional<UniValue> value;
  KeyInfo keyinfo;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> val;
  string key;
  undefined8 in_stack_fffffffffffffe28;
  string *error_00;
  ArgsManager *pAVar15;
  char **ppcVar16;
  unique_lock<std::recursive_mutex> local_198;
  undefined1 local_188 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_170 [4];
  bool local_130;
  string local_128;
  long *local_108 [2];
  long local_f8 [2];
  undefined1 local_e8 [40];
  pointer local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  string local_a0;
  string local_80;
  char local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_198._M_owns = false;
  error_00 = error;
  local_198._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_198);
  this_00 = &(this->m_settings).command_line_options;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::clear(&this_00->_M_t);
  if (argc < 2) {
LAB_00115171:
    pmVar5 = common::
             FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>&,char_const(&)[12]>
                       (this_00,(char (*) [12])"includeconf");
    if (pmVar5 != (mapped_type *)0x0) {
      common::SettingsSpan::SettingsSpan((SettingsSpan *)&local_80,pmVar5);
      bVar1 = common::SettingsSpan::empty((SettingsSpan *)&local_80);
      if (!bVar1) {
        pSVar6 = common::SettingsSpan::begin((SettingsSpan *)&local_80);
        UniValue::write_abi_cxx11_((UniValue *)local_e8,(int)pSVar6,(void *)0x0,0);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,0,0,"-includeconf cannot be used from commandline; -includeconf=",
                         0x3b);
        local_188._0_8_ = (pbVar7->_M_dataplus)._M_p;
        paVar9 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._0_8_ == paVar9) {
          local_188._16_8_ = paVar9->_M_allocated_capacity;
          aaStack_170[0]._0_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_188._0_8_ = local_188 + 0x10;
        }
        else {
          local_188._16_8_ = paVar9->_M_allocated_capacity;
        }
        local_188._8_8_ = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (error_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_188);
        if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
          operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
        }
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
        }
        if (!bVar1) goto LAB_00115283;
      }
    }
    bVar1 = true;
  }
  else {
    this_01 = &this->m_command;
    iVar10 = 1;
    pAVar15 = this;
    ppcVar16 = argv;
    do {
      lVar13 = (long)iVar10;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58._M_local_buf,ppcVar16[lVar13],(allocator<char> *)local_188);
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58
                      ,"-");
      uVar8 = local_58._M_allocated_capacity;
      if (iVar2 == 0) {
        cVar14 = '\x02';
      }
      else {
        local_60 = '\0';
        if ((string *)local_58._8_8_ == (string *)0x0) {
          psVar11 = (string *)0xffffffffffffffff;
        }
        else {
          this = pAVar15;
          pvVar3 = memchr((void *)local_58._M_allocated_capacity,0x3d,local_58._8_8_);
          error = (string *)((long)pvVar3 - uVar8);
          psVar11 = (string *)(-(ulong)(pvVar3 == (void *)0x0) | (ulong)error);
          pAVar15 = this;
        }
        if (psVar11 != (string *)0xffffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                     (size_type)((long)&(psVar11->_M_dataplus)._M_p + 1),0xffffffffffffffff);
          std::optional<std::__cxx11::string>::operator=
                    ((optional<std::__cxx11::string> *)&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188)
          ;
          if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
            operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
          }
          if ((ulong)local_58._8_8_ < psVar11) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar8 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase",psVar11);
              if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
                operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock(&local_198);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar8);
              }
            }
            goto LAB_00115483;
          }
          *(char *)((long)&(psVar11->_M_dataplus)._M_p + local_58._M_allocated_capacity) = '\0';
          error = (string *)local_58._8_8_;
          local_58._8_8_ = psVar11;
        }
        ppcVar12 = ppcVar16 + lVar13;
        if (*(char *)local_58._M_allocated_capacity == '-') {
          if (((string *)0x1 < (ulong)local_58._8_8_) &&
             (*(char *)(local_58._M_allocated_capacity + 1) == '-')) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_58,0,1);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                     0,1);
          local_108[0] = local_f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_108,local_58._M_allocated_capacity,
                     (char *)(local_58._8_8_ + local_58._M_allocated_capacity));
          key_00._M_string_length = (size_type)error_00;
          key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe28;
          key_00.field_2._M_allocated_capacity = (size_type)pAVar15;
          key_00.field_2._8_8_ = ppcVar16;
          InterpretKey((KeyInfo *)local_e8,key_00);
          if (local_108[0] != local_f8) {
            operator_delete(local_108[0],local_f8[0] + 1);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_188,'-',
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8);
          oVar4 = GetArgFlags(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_188);
          this = pAVar15;
          if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
            operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
            this = pAVar15;
          }
          if ((((ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) ||
             (local_c0 != (pointer)0x0)) {
            tinyformat::format<char_const*>
                      (&local_128,(tinyformat *)"Invalid parameter %s",(char *)ppcVar12,
                       (char **)error);
            ParseParameters();
            cVar14 = true;
            pAVar15 = this;
          }
          else {
            psVar11 = (string *)0x0;
            if (local_60 != '\0') {
              psVar11 = &local_80;
            }
            error = (string *)
                    ((ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int> & 0xffffffff);
            InterpretValue((optional<UniValue> *)local_188,(KeyInfo *)local_e8,psVar11,
                           oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_int>._M_payload,error_00);
            cVar14 = local_130 == false;
            pAVar15 = this;
            if (!(bool)cVar14) {
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                       ::operator[](this_00,(key_type *)local_e8);
              std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                        (pmVar5,(value_type *)local_188);
            }
            if (local_130 == true) {
              std::_Optional_payload_base<UniValue>::_M_destroy
                        ((_Optional_payload_base<UniValue> *)local_188);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._32_8_ != &local_b8) {
            operator_delete((void *)local_e8._32_8_,local_b8._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
            operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
          }
        }
        else {
          if ((this->m_accept_any_command == false) &&
             ((this->m_command).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this->m_command).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            oVar4 = GetArgFlags(this,(string *)&local_58);
            error = (string *)0x100000800;
            if ((~(ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int> & 0x100000800) != 0) {
              tinyformat::format<char_const*>
                        (&local_a0,(tinyformat *)"Invalid command \'%s\'",(char *)ppcVar12,
                         (char **)0x100000800);
              ParseParameters();
              cVar14 = '\x01';
              goto LAB_0011507a;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_01,(value_type *)&local_58);
          ppcVar12 = argv + lVar13 + 1;
          while (lVar13 = lVar13 + 1, lVar13 < (long)(ulong)(uint)argc) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
                       ppcVar12);
            ppcVar12 = ppcVar12 + 1;
          }
          cVar14 = '\x02';
          iVar10 = (int)lVar13;
        }
LAB_0011507a:
        if (local_60 == '\x01') {
          local_60 = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_allocated_capacity != &local_48) {
        operator_delete((void *)local_58._M_allocated_capacity,local_48._M_allocated_capacity + 1);
      }
      if (cVar14 != '\0') goto LAB_00115168;
      iVar10 = iVar10 + 1;
    } while (iVar10 < argc);
    cVar14 = '\x02';
LAB_00115168:
    if (cVar14 == '\x02') goto LAB_00115171;
LAB_00115283:
    bVar1 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_198);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
LAB_00115483:
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::ParseParameters(int argc, const char* const argv[], std::string& error)
{
    LOCK(cs_args);
    m_settings.command_line_options.clear();

    for (int i = 1; i < argc; i++) {
        std::string key(argv[i]);

#ifdef MAC_OSX
        // At the first time when a user gets the "App downloaded from the
        // internet" warning, and clicks the Open button, macOS passes
        // a unique process serial number (PSN) as -psn_... command-line
        // argument, which we filter out.
        if (key.substr(0, 5) == "-psn_") continue;
#endif

        if (key == "-") break; //bitcoin-tx using stdin
        std::optional<std::string> val;
        size_t is_index = key.find('=');
        if (is_index != std::string::npos) {
            val = key.substr(is_index + 1);
            key.erase(is_index);
        }
#ifdef WIN32
        key = ToLower(key);
        if (key[0] == '/')
            key[0] = '-';
#endif

        if (key[0] != '-') {
            if (!m_accept_any_command && m_command.empty()) {
                // The first non-dash arg is a registered command
                std::optional<unsigned int> flags = GetArgFlags(key);
                if (!flags || !(*flags & ArgsManager::COMMAND)) {
                    error = strprintf("Invalid command '%s'", argv[i]);
                    return false;
                }
            }
            m_command.push_back(key);
            while (++i < argc) {
                // The remaining args are command args
                m_command.emplace_back(argv[i]);
            }
            break;
        }

        // Transform --foo to -foo
        if (key.length() > 1 && key[1] == '-')
            key.erase(0, 1);

        // Transform -foo to foo
        key.erase(0, 1);
        KeyInfo keyinfo = InterpretKey(key);
        std::optional<unsigned int> flags = GetArgFlags('-' + keyinfo.name);

        // Unknown command line options and command line options with dot
        // characters (which are returned from InterpretKey with nonempty
        // section strings) are not valid.
        if (!flags || !keyinfo.section.empty()) {
            error = strprintf("Invalid parameter %s", argv[i]);
            return false;
        }

        std::optional<common::SettingsValue> value = InterpretValue(keyinfo, val ? &*val : nullptr, *flags, error);
        if (!value) return false;

        m_settings.command_line_options[keyinfo.name].push_back(*value);
    }

    // we do not allow -includeconf from command line, only -noincludeconf
    if (auto* includes = common::FindKey(m_settings.command_line_options, "includeconf")) {
        const common::SettingsSpan values{*includes};
        // Range may be empty if -noincludeconf was passed
        if (!values.empty()) {
            error = "-includeconf cannot be used from commandline; -includeconf=" + values.begin()->write();
            return false; // pick first value as example
        }
    }
    return true;
}